

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O0

int __thiscall
skiwi::environment<skiwi::environment_entry>::remove
          (environment<skiwi::environment_entry> *this,char *__filename)

{
  bool bVar1;
  int extraout_EAX;
  element_type *peVar2;
  _Self local_68 [3];
  _Base_ptr local_50;
  undefined1 local_48 [8];
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> p_outer_copy;
  _Self local_28;
  _Self local_20;
  iterator it;
  string *name_local;
  environment<skiwi::environment_entry> *this_local;
  
  it._M_node = (_Base_ptr)__filename;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>_>
       ::find(&this->env,(key_type *)__filename);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>_>
       ::end(&this->env);
  bVar1 = std::operator!=(&local_20,&local_28);
  if (bVar1) {
    p_outer_copy.
    super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         map<std::__cxx11::string,skiwi::environment_entry,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,skiwi::environment_entry>>>
         ::erase_abi_cxx11_((map<std::__cxx11::string,skiwi::environment_entry,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,skiwi::environment_entry>>>
                             *)this,(iterator)local_20._M_node);
  }
  std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::shared_ptr
            ((shared_ptr<skiwi::environment<skiwi::environment_entry>_> *)local_48,&this->p_outer);
  while (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48), bVar1) {
    peVar2 = std::
             __shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
    local_50 = (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>_>
               ::find(&peVar2->env,it._M_node);
    local_20._M_node = local_50;
    peVar2 = std::
             __shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
    local_68[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>_>
         ::end(&peVar2->env);
    bVar1 = std::operator!=(&local_20,local_68);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
      std::
      map<std::__cxx11::string,skiwi::environment_entry,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,skiwi::environment_entry>>>
      ::erase_abi_cxx11_((map<std::__cxx11::string,skiwi::environment_entry,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,skiwi::environment_entry>>>
                          *)peVar2,(iterator)local_20._M_node);
    }
    peVar2 = std::
             __shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
    std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::operator=
              ((shared_ptr<skiwi::environment<skiwi::environment_entry>_> *)local_48,
               &peVar2->p_outer);
  }
  std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::~shared_ptr
            ((shared_ptr<skiwi::environment<skiwi::environment_entry>_> *)local_48);
  return extraout_EAX;
}

Assistant:

void remove(const std::string& name)
      {
      auto it = env.find(name);
      if (it != env.end())
        {
        env.erase(it);
        }
      //if (p_outer)
      //  p_outer->remove(name);
      auto p_outer_copy = p_outer;
      while (p_outer_copy)
        {
        it = p_outer_copy->env.find(name);
        if (it != p_outer_copy->env.end())
          {
          p_outer_copy->env.erase(it);
          }
        p_outer_copy = p_outer_copy->p_outer;
        }
      }